

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# kinsol_ls.c
# Opt level: O0

int KINSetJacTimesVecSysFn(void *kinmem,KINSysFn jtimesSysFn)

{
  long in_RSI;
  KINLsMem kinls_mem;
  KINMem kin_mem;
  int retval;
  KINMem *in_stack_ffffffffffffffc8;
  long lVar1;
  KINMem kin_mem_00;
  int local_4;
  
  kin_mem_00 = (KINMem)0x0;
  lVar1 = 0;
  local_4 = kinLs_AccessLMem((void *)0x0,(char *)0x0,in_stack_ffffffffffffffc8,(KINLsMem *)0x115abb)
  ;
  if (local_4 == 0) {
    if (*(int *)(lVar1 + 0x98) == 0) {
      KINProcessError(kin_mem_00,-3,0x170,"KINSetJacTimesVecSysFn",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/opencor[P]sundials/src/kinsol/kinsol_ls.c"
                      ,"Internal finite-difference Jacobian-vector product is disabled.");
      local_4 = -3;
    }
    else {
      if (in_RSI == 0) {
        *(KINSysFn *)(lVar1 + 0xa8) = kin_mem_00->kin_func;
      }
      else {
        *(long *)(lVar1 + 0xa8) = in_RSI;
      }
      local_4 = 0;
    }
  }
  return local_4;
}

Assistant:

int KINSetJacTimesVecSysFn(void* kinmem, KINSysFn jtimesSysFn)
{
  int retval;
  KINMem kin_mem     = NULL;
  KINLsMem kinls_mem = NULL;

  /* access KINLsMem structure */
  retval = kinLs_AccessLMem(kinmem, __func__, &kin_mem, &kinls_mem);
  if (retval != KIN_SUCCESS) { return (retval); }

  /* check if using internal finite difference approximation */
  if (!(kinls_mem->jtimesDQ))
  {
    KINProcessError(kin_mem, KINLS_ILL_INPUT, __LINE__, __func__,
                    __FILE__, "Internal finite-difference Jacobian-vector product is disabled.");
    return (KINLS_ILL_INPUT);
  }

  /* store function pointers for system function (NULL implies use kin_func) */
  if (jtimesSysFn != NULL) { kinls_mem->jt_func = jtimesSysFn; }
  else { kinls_mem->jt_func = kin_mem->kin_func; }

  return (KINLS_SUCCESS);
}